

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

UBool isSingleOrLead(int32_t (*stateTable) [256],uint8_t state,UBool isDBCSOnly,uint8_t b)

{
  uint uVar1;
  byte bVar2;
  uint8_t action;
  int32_t entry;
  int32_t *row;
  uint8_t b_local;
  UBool isDBCSOnly_local;
  uint8_t state_local;
  int32_t (*stateTable_local) [256];
  
  uVar1 = stateTable[state][b];
  if ((int)uVar1 < 0) {
    bVar2 = (byte)(uVar1 >> 0x14) & 0xf;
    if ((bVar2 == 8) && (isDBCSOnly != '\0')) {
      stateTable_local._7_1_ = '\0';
    }
    else {
      stateTable_local._7_1_ = bVar2 != 7;
    }
  }
  else {
    stateTable_local._7_1_ = hasValidTrailBytes(stateTable,(uint8_t)(uVar1 >> 0x18));
  }
  return stateTable_local._7_1_;
}

Assistant:

static UBool
isSingleOrLead(const int32_t (*stateTable)[256], uint8_t state, UBool isDBCSOnly, uint8_t b) {
    const int32_t *row=stateTable[state];
    int32_t entry=row[b];
    if(MBCS_ENTRY_IS_TRANSITION(entry)) {   /* lead byte */
        return hasValidTrailBytes(stateTable, (uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry));
    } else {
        uint8_t action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
        if(action==MBCS_STATE_CHANGE_ONLY && isDBCSOnly) {
            return FALSE;   /* SI/SO are illegal for DBCS-only conversion */
        } else {
            return action!=MBCS_STATE_ILLEGAL;
        }
    }
}